

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_trie.cpp
# Opt level: O0

MppTrieInfo * mpp_trie_get_info_from_root(void *root,char *name)

{
  MppTrieNode *pMVar1;
  MppTrieNode *node;
  char *name_local;
  void *root_local;
  
  if ((root == (void *)0x0) || (name == (char *)0x0)) {
    _mpp_log_l(2,"mpp_trie","invalid root %p name %p\n","mpp_trie_get_info_from_root",root,name);
    root_local = (void *)0x0;
  }
  else {
    pMVar1 = mpp_trie_get_node((MppTrieNode *)root,name);
    if ((pMVar1 == (MppTrieNode *)0x0) || (pMVar1->id < 0)) {
      root_local = (void *)0x0;
    }
    else {
      root_local = (void *)((long)root + (long)pMVar1->id);
    }
  }
  return (MppTrieInfo *)root_local;
}

Assistant:

MppTrieInfo *mpp_trie_get_info_from_root(void *root, const char *name)
{
    MppTrieNode *node;

    if (!root || !name) {
        mpp_loge_f("invalid root %p name %p\n", root, name);
        return NULL;
    }

    node = mpp_trie_get_node((MppTrieNode *)root, name);
    if (!node || node->id < 0)
        return NULL;

    return (MppTrieInfo *)(((char *)root) + node->id);
}